

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_model_animation_array
rf_load_model_animations_from_iqm
          (uchar *data,int data_size,rf_allocator allocator,rf_allocator temp_allocator)

{
  rf_model_animation *prVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  long lVar16;
  long lVar17;
  rf_source_location rVar18;
  rf_source_location rVar19;
  rf_source_location rVar20;
  rf_source_location rVar21;
  rf_source_location rVar22;
  rf_source_location rVar23;
  rf_source_location rVar24;
  rf_source_location rVar25;
  rf_source_location rVar26;
  rf_source_location rVar27;
  rf_allocator_args rVar28;
  rf_allocator_args rVar29;
  rf_allocator_args rVar30;
  undefined1 auVar31 [24];
  undefined1 auVar32 [24];
  undefined1 auVar33 [24];
  undefined1 auVar34 [24];
  undefined1 auVar35 [24];
  undefined1 auVar36 [24];
  undefined1 auVar37 [24];
  char *pcVar38;
  rf_model_animation *prVar39;
  int iVar40;
  ulong uVar41;
  void *__dest;
  void *__dest_00;
  rf_bone_info *prVar42;
  rf_transform **pprVar43;
  int *piVar44;
  rf_transform *prVar45;
  long lVar46;
  ulong uVar47;
  float *pfVar48;
  long lVar49;
  ulong uVar50;
  size_t sVar51;
  undefined8 uVar52;
  ulong uVar53;
  long lVar54;
  long in_FS_OFFSET;
  uint uVar55;
  float fVar56;
  float fVar58;
  undefined1 auVar57 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  rf_model_animation_array rVar62;
  rf_vec3 rVar63;
  rf_quaternion q;
  rf_iqm_header iqm;
  rf_allocator local_328;
  int *local_318;
  int local_30c;
  rf_model_animation *local_308;
  ulong local_300;
  rf_allocator local_2f8;
  float *local_2e8;
  ulong local_2e0;
  void *local_2d8;
  undefined8 uStack_2d0;
  undefined4 local_2c8;
  uint uStack_2c4;
  char *local_2c0;
  char *pcStack_2b8;
  undefined8 local_2b0;
  int *local_2a8;
  undefined8 uStack_2a0;
  undefined4 local_298;
  uint uStack_294;
  char *local_290;
  char *pcStack_288;
  undefined8 local_280;
  void *local_278;
  undefined8 uStack_270;
  undefined4 local_268;
  uint uStack_264;
  char *local_260;
  char *pcStack_258;
  undefined8 local_250;
  undefined8 local_248;
  long lStack_240;
  undefined4 local_238;
  uint uStack_234;
  char *local_230;
  char *pcStack_228;
  undefined8 local_220;
  undefined8 local_218;
  long lStack_210;
  undefined4 local_208;
  uint uStack_204;
  char *local_200;
  char *pcStack_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  long lStack_1e0;
  undefined4 local_1d8;
  uint uStack_1d4;
  char *local_1d0;
  char *pcStack_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  size_t sStack_1b0;
  undefined4 local_1a8;
  uint uStack_1a4;
  char *local_1a0;
  char *pcStack_198;
  undefined8 local_190;
  undefined8 local_188;
  long lStack_180;
  undefined4 local_178;
  uint uStack_174;
  char *local_170;
  char *pcStack_168;
  undefined8 local_160;
  undefined8 local_158;
  size_t sStack_150;
  undefined4 local_148;
  uint uStack_144;
  char *local_140;
  char *pcStack_138;
  undefined8 local_130;
  undefined8 local_128;
  size_t sStack_120;
  undefined4 local_118;
  uint uStack_114;
  char *local_110;
  char *pcStack_108;
  undefined8 local_100;
  char *local_f8;
  char *pcStack_f0;
  undefined8 local_e8;
  char *local_e0;
  char *pcStack_d8;
  undefined8 local_d0;
  char local_c4;
  char cStack_c3;
  char cStack_c2;
  char cStack_c1;
  char cStack_c0;
  char cStack_bf;
  char cStack_be;
  char cStack_bd;
  char cStack_bc;
  char cStack_bb;
  char cStack_ba;
  char cStack_b9;
  char cStack_b8;
  char cStack_b7;
  char cStack_b6;
  char cStack_b5;
  int local_b4;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  int local_68;
  int local_64;
  uint local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  
  local_2f8.user_data = temp_allocator.user_data;
  local_328.allocator_proc = allocator.allocator_proc;
  local_328.user_data = allocator.user_data;
  local_300 = 0;
  local_308 = (rf_model_animation *)0x0;
  if (data_size != 0 && data != (uchar *)0x0) {
    local_2f8.allocator_proc = temp_allocator.allocator_proc;
    memcpy(&local_c4,data,0x7c);
    auVar57[0] = -(local_c4 == 'I');
    auVar57[1] = -(cStack_c3 == 'N');
    auVar57[2] = -(cStack_c2 == 'T');
    auVar57[3] = -(cStack_c1 == 'E');
    auVar57[4] = -(cStack_c0 == 'R');
    auVar57[5] = -(cStack_bf == 'Q');
    auVar57[6] = -(cStack_be == 'U');
    auVar57[7] = -(cStack_bd == 'A');
    auVar57[8] = -(cStack_bc == 'K');
    auVar57[9] = -(cStack_bb == 'E');
    auVar57[10] = -(cStack_ba == 'M');
    auVar57[0xb] = -(cStack_b9 == 'O');
    auVar57[0xc] = -(cStack_b8 == 'D');
    auVar57[0xd] = -(cStack_b7 == 'E');
    auVar57[0xe] = -(cStack_b6 == 'L');
    auVar57[0xf] = -(cStack_b5 == '\0');
    if ((ushort)((ushort)(SUB161(auVar57 >> 7,0) & 1) | (ushort)(SUB161(auVar57 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar57 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar57 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar57 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar57 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar57 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar57 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar57 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar57 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar57 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar57 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar57 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar57 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar57 >> 0x77,0) & 1) << 0xe | (ushort)(auVar57[0xf] >> 7) << 0xf
                ) == 0xffff) {
      if (local_b4 == 2) {
        local_110 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_108 = "rf_load_model_animations_from_iqm";
        local_100 = 0x8670;
        local_128 = 0;
        uVar41 = (ulong)local_78;
        sVar51 = uVar41 * 0x58;
        local_118 = 0;
        rVar18.proc_name = "rf_load_model_animations_from_iqm";
        rVar18.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar18.line_in_file = 0x8670;
        auVar31._8_8_ = (ulong)uStack_114 << 0x20;
        auVar31._0_8_ = sVar51;
        auVar31._16_8_ = 0;
        sStack_120 = sVar51;
        local_318 = (int *)(*temp_allocator.allocator_proc)
                                     (&local_2f8,rVar18,RF_AM_ALLOC,
                                      (rf_allocator_args)(auVar31 << 0x40));
        memcpy(local_318,data + local_74,sVar51);
        local_140 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_138 = "rf_load_model_animations_from_iqm";
        local_130 = 0x8674;
        local_158 = 0;
        uVar50 = (ulong)local_70;
        sVar51 = uVar50 * 0x14;
        local_148 = 0;
        rVar19.proc_name = "rf_load_model_animations_from_iqm";
        rVar19.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar19.line_in_file = 0x8674;
        auVar32._8_8_ = (ulong)uStack_144 << 0x20;
        auVar32._0_8_ = sVar51;
        auVar32._16_8_ = 0;
        sStack_150 = sVar51;
        __dest = (*local_2f8.allocator_proc)
                           (&local_2f8,rVar19,RF_AM_ALLOC,(rf_allocator_args)(auVar32 << 0x40));
        memcpy(__dest,data + local_6c,sVar51);
        local_170 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_168 = "rf_load_model_animations_from_iqm";
        local_160 = 0x8677;
        local_188 = 0;
        lStack_180 = uVar50 << 5;
        local_178 = 0;
        rVar20.proc_name = "rf_load_model_animations_from_iqm";
        rVar20.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar20.line_in_file = 0x8677;
        auVar33._8_8_ = (ulong)uStack_174 << 0x20;
        auVar33._0_8_ = lStack_180;
        auVar33._16_8_ = 0;
        local_308 = (rf_model_animation *)
                    (*local_328.allocator_proc)
                              (&local_328,rVar20,RF_AM_ALLOC,(rf_allocator_args)(auVar33 << 0x40));
        local_1a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_198 = "rf_load_model_animations_from_iqm";
        local_190 = 0x867d;
        local_1b8 = 0;
        local_30c = local_64;
        sVar51 = (ulong)(uint)(local_68 * local_64) * 2;
        local_1a8 = 0;
        rVar21.proc_name = "rf_load_model_animations_from_iqm";
        rVar21.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar21.line_in_file = 0x867d;
        auVar34._8_8_ = (ulong)uStack_1a4 << 0x20;
        auVar34._0_8_ = sVar51;
        auVar34._16_8_ = 0;
        sStack_1b0 = sVar51;
        __dest_00 = (*local_2f8.allocator_proc)
                              (&local_2f8,rVar21,RF_AM_ALLOC,(rf_allocator_args)(auVar34 << 0x40));
        memcpy(__dest_00,data + local_60,sVar51);
        local_300 = uVar50;
        if (uVar50 != 0) {
          lVar17 = uVar41 * 0x28;
          local_2e8 = (float *)(local_318 + 0x15);
          uVar50 = 0;
          do {
            prVar39 = local_308;
            prVar1 = local_308 + uVar50;
            local_308[uVar50].frame_count = (ulong)*(uint *)((long)__dest + uVar50 * 0x14 + 8);
            local_308[uVar50].bone_count = uVar41;
            local_1d0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            pcStack_1c8 = "rf_load_model_animations_from_iqm";
            local_1c0 = 0x8684;
            local_1e8 = 0;
            local_1d8 = 0;
            rVar22.proc_name = "rf_load_model_animations_from_iqm";
            rVar22.file_name =
                 "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            rVar22.line_in_file = 0x8684;
            auVar35._8_8_ = (ulong)uStack_1d4 << 0x20;
            auVar35._0_8_ = lVar17;
            auVar35._16_8_ = 0;
            local_2e0 = uVar50;
            lStack_1e0 = lVar17;
            prVar42 = (rf_bone_info *)
                      (*local_328.allocator_proc)
                                (&local_328,rVar22,RF_AM_ALLOC,(rf_allocator_args)(auVar35 << 0x40))
            ;
            prVar39[uVar50].bones = prVar42;
            local_200 = 
            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            pcStack_1f8 = "rf_load_model_animations_from_iqm";
            local_1f0 = 0x8685;
            local_218 = 0;
            lStack_210 = (ulong)*(uint *)((long)__dest + uVar50 * 0x14 + 8) << 3;
            local_208 = 0;
            rVar23.proc_name = "rf_load_model_animations_from_iqm";
            rVar23.file_name =
                 "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            rVar23.line_in_file = 0x8685;
            auVar36._8_8_ = (ulong)uStack_204 << 0x20;
            auVar36._0_8_ = lStack_210;
            auVar36._16_8_ = 0;
            pprVar43 = (rf_transform **)
                       (*local_328.allocator_proc)
                                 (&local_328,rVar23,RF_AM_ALLOC,(rf_allocator_args)(auVar36 << 0x40)
                                 );
            prVar39[uVar50].frame_poses = pprVar43;
            if (local_78 != 0) {
              prVar42 = prVar1->bones;
              lVar46 = 0;
              piVar44 = local_318;
              do {
                builtin_strncpy(pcVar38 + lVar46,"ANIMJOINTNAME",0xe);
                pcVar38 = prVar42->name;
                prVar42 = prVar1->bones;
                *(long *)(prVar42->name + lVar46 + 0x20) = (long)*piVar44;
                lVar46 = lVar46 + 0x28;
                piVar44 = piVar44 + 0x16;
              } while (lVar17 != lVar46);
            }
            if (*(int *)((long)__dest + uVar50 * 0x14 + 8) != 0) {
              uVar53 = 0;
              do {
                local_230 = 
                "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                ;
                pcStack_228 = "rf_load_model_animations_from_iqm";
                local_220 = 0x8690;
                local_248 = 0;
                local_238 = 0;
                rVar24.proc_name = "rf_load_model_animations_from_iqm";
                rVar24.file_name =
                     "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                ;
                rVar24.line_in_file = 0x8690;
                auVar37._8_8_ = (ulong)uStack_234 << 0x20;
                auVar37._0_8_ = lVar17;
                auVar37._16_8_ = 0;
                lStack_240 = lVar17;
                prVar45 = (rf_transform *)
                          (*local_328.allocator_proc)
                                    (&local_328,rVar24,RF_AM_ALLOC,
                                     (rf_allocator_args)(auVar37 << 0x40));
                prVar1->frame_poses[uVar53] = prVar45;
                uVar53 = uVar53 + 1;
                uVar55 = *(uint *)((long)__dest + uVar50 * 0x14 + 8);
                uVar47 = (ulong)uVar55;
              } while (uVar53 < uVar47);
              if (uVar55 != 0) {
                iVar40 = *(int *)((long)__dest + uVar50 * 0x14 + 4) * local_30c;
                uVar53 = 0;
                do {
                  if (local_78 != 0) {
                    lVar46 = 0;
                    pfVar48 = local_2e8;
                    do {
                      fVar61 = pfVar48[-0x13];
                      prVar45 = prVar1->frame_poses[uVar53];
                      *(float *)((long)&(prVar45->translation).x + lVar46) = fVar61;
                      fVar56 = pfVar48[-0x14];
                      if (((uint)fVar56 & 1) != 0) {
                        *(float *)((long)&(prVar45->translation).x + lVar46) =
                             (float)*(ushort *)((long)__dest_00 + (long)iVar40 * 2) * pfVar48[-9] +
                             fVar61;
                        iVar40 = iVar40 + 1;
                      }
                      fVar61 = pfVar48[-0x12];
                      *(float *)((long)&(prVar45->translation).y + lVar46) = fVar61;
                      if (((uint)fVar56 & 2) != 0) {
                        *(float *)((long)&(prVar45->translation).y + lVar46) =
                             (float)*(ushort *)((long)__dest_00 + (long)iVar40 * 2) * pfVar48[-8] +
                             fVar61;
                        iVar40 = iVar40 + 1;
                      }
                      fVar61 = pfVar48[-0x11];
                      *(float *)((long)&(prVar45->translation).z + lVar46) = fVar61;
                      if (((uint)fVar56 & 4) != 0) {
                        *(float *)((long)&(prVar45->translation).z + lVar46) =
                             (float)*(ushort *)((long)__dest_00 + (long)iVar40 * 2) * pfVar48[-7] +
                             fVar61;
                        iVar40 = iVar40 + 1;
                      }
                      fVar61 = pfVar48[-0x10];
                      *(float *)((long)&(prVar45->rotation).x + lVar46) = fVar61;
                      if (((uint)fVar56 & 8) != 0) {
                        *(float *)((long)&(prVar45->rotation).x + lVar46) =
                             (float)*(ushort *)((long)__dest_00 + (long)iVar40 * 2) * pfVar48[-6] +
                             fVar61;
                        iVar40 = iVar40 + 1;
                      }
                      fVar61 = pfVar48[-0xf];
                      *(float *)((long)&(prVar45->rotation).y + lVar46) = fVar61;
                      if (((uint)fVar56 & 0x10) != 0) {
                        *(float *)((long)&(prVar45->rotation).y + lVar46) =
                             (float)*(ushort *)((long)__dest_00 + (long)iVar40 * 2) * pfVar48[-5] +
                             fVar61;
                        iVar40 = iVar40 + 1;
                      }
                      fVar61 = pfVar48[-0xe];
                      *(float *)((long)&(prVar45->rotation).z + lVar46) = fVar61;
                      if (((uint)fVar56 & 0x20) != 0) {
                        *(float *)((long)&(prVar45->rotation).z + lVar46) =
                             (float)*(ushort *)((long)__dest_00 + (long)iVar40 * 2) * pfVar48[-4] +
                             fVar61;
                        iVar40 = iVar40 + 1;
                      }
                      fVar61 = pfVar48[-0xd];
                      *(float *)((long)&(prVar45->rotation).w + lVar46) = fVar61;
                      if (((uint)fVar56 & 0x40) != 0) {
                        *(float *)((long)&(prVar45->rotation).w + lVar46) =
                             (float)*(ushort *)((long)__dest_00 + (long)iVar40 * 2) * pfVar48[-3] +
                             fVar61;
                        iVar40 = iVar40 + 1;
                      }
                      fVar61 = pfVar48[-0xc];
                      *(float *)((long)&(prVar45->scale).x + lVar46) = fVar61;
                      if (SUB41(fVar56,0) < '\0') {
                        *(float *)((long)&(prVar45->scale).x + lVar46) =
                             (float)*(ushort *)((long)__dest_00 + (long)iVar40 * 2) * pfVar48[-2] +
                             fVar61;
                        iVar40 = iVar40 + 1;
                      }
                      fVar61 = pfVar48[-0xb];
                      *(float *)((long)&(prVar45->scale).y + lVar46) = fVar61;
                      if (((uint)fVar56 >> 8 & 1) != 0) {
                        *(float *)((long)&(prVar45->scale).y + lVar46) =
                             (float)*(ushort *)((long)__dest_00 + (long)iVar40 * 2) * pfVar48[-1] +
                             fVar61;
                        iVar40 = iVar40 + 1;
                      }
                      fVar61 = pfVar48[-10];
                      *(float *)((long)&(prVar45->scale).z + lVar46) = fVar61;
                      if (((uint)fVar56 >> 9 & 1) != 0) {
                        *(float *)((long)&(prVar45->scale).z + lVar46) =
                             (float)*(ushort *)((long)__dest_00 + (long)iVar40 * 2) * *pfVar48 +
                             fVar61;
                        iVar40 = iVar40 + 1;
                      }
                      uVar52 = *(undefined8 *)((long)&(prVar45->rotation).x + lVar46);
                      uVar9 = *(undefined8 *)((long)&(prVar45->rotation).z + lVar46);
                      fVar56 = (float)uVar52;
                      fVar58 = (float)((ulong)uVar52 >> 0x20);
                      fVar59 = (float)uVar9;
                      fVar60 = (float)((ulong)uVar9 >> 0x20);
                      fVar61 = SQRT(fVar60 * fVar60 +
                                    fVar59 * fVar59 + fVar56 * fVar56 + fVar58 * fVar58);
                      uVar55 = -(uint)(fVar61 == 0.0);
                      fVar61 = (float)(uVar55 & 0x3f800000 | ~uVar55 & (uint)(1.0 / fVar61));
                      puVar2 = (undefined8 *)((long)&(prVar45->rotation).x + lVar46);
                      *puVar2 = CONCAT44(fVar58 * fVar61,fVar56 * fVar61);
                      *(float *)(puVar2 + 1) = fVar61 * fVar59;
                      *(float *)((long)puVar2 + 0xc) = fVar61 * fVar60;
                      lVar46 = lVar46 + 0x28;
                      pfVar48 = pfVar48 + 0x16;
                    } while (lVar17 != lVar46);
                    uVar47 = (ulong)*(uint *)((long)__dest + uVar50 * 0x14 + 8);
                  }
                  uVar53 = uVar53 + 1;
                } while (uVar53 < uVar47);
                if ((int)uVar47 != 0) {
                  lVar46 = prVar1->bone_count;
                  uVar53 = 0;
                  do {
                    if (0 < lVar46) {
                      lVar54 = 0;
                      lVar49 = 0;
                      do {
                        lVar16 = *(long *)(prVar1->bones->name + lVar54 + 0x20);
                        if (-1 < lVar16) {
                          prVar45 = prVar1->frame_poses[uVar53];
                          uVar3 = prVar45[lVar16].rotation.x;
                          uVar10 = prVar45[lVar16].rotation.y;
                          uVar4 = prVar45[lVar16].rotation.z;
                          uVar11 = prVar45[lVar16].rotation.w;
                          uVar52 = *(undefined8 *)((long)&(prVar45->rotation).x + lVar54);
                          uVar9 = *(undefined8 *)((long)&(prVar45->rotation).z + lVar54);
                          fVar61 = (float)uVar52;
                          fVar56 = (float)((ulong)uVar52 >> 0x20);
                          fVar58 = (float)uVar9;
                          fVar59 = (float)((ulong)uVar9 >> 0x20);
                          *(ulong *)((long)&(prVar45->rotation).x + lVar54) =
                               CONCAT44(fVar58 * -(float)uVar3 +
                                        fVar61 * (float)uVar4 +
                                        (float)uVar10 * fVar59 + (float)uVar11 * fVar56,
                                        fVar56 * -(float)uVar4 +
                                        fVar58 * (float)uVar10 +
                                        (float)uVar3 * fVar59 + (float)uVar11 * fVar61);
                          *(ulong *)((long)&(prVar45->rotation).z + lVar54) =
                               CONCAT44((fVar56 * -(float)uVar10 +
                                        fVar59 * (float)uVar11 + fVar61 * -(float)uVar3) -
                                        fVar58 * (float)uVar4,
                                        (fVar56 * (float)uVar3 +
                                        fVar59 * (float)uVar4 + (float)uVar11 * fVar58) -
                                        fVar61 * (float)uVar10);
                          prVar45 = prVar1->frame_poses[uVar53];
                          lVar46 = *(long *)(prVar1->bones->name + lVar54 + 0x20);
                          uVar5 = prVar45[lVar46].rotation.x;
                          uVar12 = prVar45[lVar46].rotation.y;
                          q.y = (float)uVar12;
                          q.x = (float)uVar5;
                          uVar6 = prVar45[lVar46].rotation.z;
                          uVar13 = prVar45[lVar46].rotation.w;
                          q.w = (float)uVar13;
                          q.z = (float)uVar6;
                          rVar63.z = *(float *)((long)&(prVar45->translation).z + lVar54);
                          rVar63._0_8_ = *(undefined8 *)((long)&(prVar45->translation).x + lVar54);
                          rVar63 = rf_vec3_rotate_by_quaternion(rVar63,q);
                          *(long *)((long)&(prVar45->translation).x + lVar54) = rVar63._0_8_;
                          *(float *)((long)&(prVar45->translation).z + lVar54) = rVar63.z;
                          prVar45 = prVar1->frame_poses[uVar53];
                          lVar46 = *(long *)(prVar1->bones->name + lVar54 + 0x20);
                          uVar52 = *(undefined8 *)((long)&(prVar45->translation).x + lVar54);
                          uVar7 = prVar45[lVar46].translation.x;
                          uVar14 = prVar45[lVar46].translation.y;
                          fVar61 = prVar45[lVar46].translation.z;
                          *(ulong *)((long)&(prVar45->translation).x + lVar54) =
                               CONCAT44((float)uVar14 + (float)((ulong)uVar52 >> 0x20),
                                        (float)uVar7 + (float)uVar52);
                          *(float *)((long)&(prVar45->translation).z + lVar54) =
                               *(float *)((long)&(prVar45->translation).z + lVar54) + fVar61;
                          prVar45 = prVar1->frame_poses[uVar53];
                          lVar46 = *(long *)(prVar1->bones->name + lVar54 + 0x20);
                          uVar52 = *(undefined8 *)((long)&(prVar45->scale).x + lVar54);
                          fVar61 = *(float *)((long)&(prVar45->scale).z + lVar54);
                          uVar8 = prVar45[lVar46].scale.x;
                          uVar15 = prVar45[lVar46].scale.y;
                          fVar56 = prVar45[lVar46].scale.z;
                          pfVar48 = (float *)((long)&(prVar45->scale).x + lVar54);
                          *pfVar48 = (float)uVar8 * (float)uVar52;
                          pfVar48[1] = (float)uVar15 * (float)((ulong)uVar52 >> 0x20);
                          *(float *)((long)&(prVar45->scale).z + lVar54) = fVar61 * fVar56;
                          lVar46 = prVar1->bone_count;
                        }
                        lVar49 = lVar49 + 1;
                        lVar54 = lVar54 + 0x28;
                      } while (lVar49 < lVar46);
                      uVar47 = (ulong)*(uint *)((long)__dest + uVar50 * 0x14 + 8);
                    }
                    uVar53 = uVar53 + 1;
                  } while (uVar53 < uVar47);
                }
              }
            }
            uVar50 = local_2e0 + 1;
          } while (uVar50 != local_300);
        }
        local_260 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_258 = "rf_load_model_animations_from_iqm";
        local_250 = 0x86fd;
        uStack_270 = 0;
        local_268 = 0;
        rVar25.proc_name = "rf_load_model_animations_from_iqm";
        rVar25.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar25.line_in_file = 0x86fd;
        rVar28.size_to_allocate_or_reallocate = 0;
        rVar28.pointer_to_free_or_realloc = __dest_00;
        rVar28._16_8_ = (ulong)uStack_264 << 0x20;
        local_278 = __dest_00;
        (*local_2f8.allocator_proc)(&local_2f8,rVar25,RF_AM_FREE,rVar28);
        local_290 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_288 = "rf_load_model_animations_from_iqm";
        local_280 = 0x86fe;
        local_2a8 = local_318;
        uStack_2a0 = 0;
        local_298 = 0;
        rVar26.proc_name = "rf_load_model_animations_from_iqm";
        rVar26.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar26.line_in_file = 0x86fe;
        rVar29.size_to_allocate_or_reallocate = 0;
        rVar29.pointer_to_free_or_realloc = local_318;
        rVar29._16_8_ = (ulong)uStack_294 << 0x20;
        (*local_2f8.allocator_proc)(&local_2f8,rVar26,RF_AM_FREE,rVar29);
        local_2c0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_2b8 = "rf_load_model_animations_from_iqm";
        local_2b0 = 0x86ff;
        uStack_2d0 = 0;
        local_2c8 = 0;
        rVar27.proc_name = "rf_load_model_animations_from_iqm";
        rVar27.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar27.line_in_file = 0x86ff;
        rVar30.size_to_allocate_or_reallocate = 0;
        rVar30.pointer_to_free_or_realloc = __dest;
        rVar30._16_8_ = (ulong)uStack_2c4 << 0x20;
        local_2d8 = __dest;
        (*local_2f8.allocator_proc)(&local_2f8,rVar27,RF_AM_FREE,rVar30);
        goto LAB_00140642;
      }
      local_f8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_f0 = "rf_load_model_animations_from_iqm";
      uVar52 = 0x8666;
      local_e8 = 0x8666;
      rf_log_impl(8,0x17bd8e,(char *)0x5);
    }
    else {
      local_38 = 0;
      local_48 = *(undefined8 *)data;
      uStack_40 = *(undefined8 *)(data + 8);
      local_e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_d8 = "rf_load_model_animations_from_iqm";
      uVar52 = 0x865f;
      local_d0 = 0x865f;
      rf_log_impl(8,0x17bd6d,(char *)0x5);
    }
    local_300 = 0;
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_load_model_animations_from_iqm";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = uVar52;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 5;
    local_308 = (rf_model_animation *)0x0;
  }
LAB_00140642:
  rVar62.anims = local_308;
  rVar62.size = local_300;
  return rVar62;
}

Assistant:

RF_API rf_model_animation_array rf_load_model_animations_from_iqm(const unsigned char* data, int data_size, rf_allocator allocator, rf_allocator temp_allocator)
{
    if (!data || !data_size) return (rf_model_animation_array) {0};

    #define RF_IQM_MAGIC "INTERQUAKEMODEL" // IQM file magic number
    #define RF_IQM_VERSION 2 // only IQM version 2 supported

    typedef struct rf_iqm_header rf_iqm_header;
    struct rf_iqm_header
    {
        char magic[16];
        unsigned int version;
        unsigned int filesize;
        unsigned int flags;
        unsigned int num_text, ofs_text;
        unsigned int num_meshes, ofs_meshes;
        unsigned int num_vertexarrays, num_vertexes, ofs_vertexarrays;
        unsigned int num_triangles, ofs_triangles, ofs_adjacency;
        unsigned int num_joints, ofs_joints;
        unsigned int num_poses, ofs_poses;
        unsigned int num_anims, ofs_anims;
        unsigned int num_frames, num_framechannels, ofs_frames, ofs_bounds;
        unsigned int num_comment, ofs_comment;
        unsigned int num_extensions, ofs_extensions;
    };

    typedef struct rf_iqm_pose rf_iqm_pose;
    struct rf_iqm_pose
    {
        int parent;
        unsigned int mask;
        float channeloffset[10];
        float channelscale[10];
    };

    typedef struct rf_iqm_anim rf_iqm_anim;
    struct rf_iqm_anim
    {
        unsigned int name;
        unsigned int first_frame, num_frames;
        float framerate;
        unsigned int flags;
    };

    rf_iqm_header iqm;

    // Read IQM header
    memcpy(&iqm, data, sizeof(rf_iqm_header));

    if (strncmp(iqm.magic, RF_IQM_MAGIC, sizeof(RF_IQM_MAGIC)))
    {
        char temp_str[sizeof(RF_IQM_MAGIC) + 1] = {0};
        memcpy(temp_str, iqm.magic, sizeof(RF_IQM_MAGIC));
        RF_LOG_ERROR(RF_BAD_FORMAT, "Magic Number \"%s\"does not match.", temp_str);

        return (rf_model_animation_array){0};
    }

    if (iqm.version != RF_IQM_VERSION)
    {
        RF_LOG_ERROR(RF_BAD_FORMAT, "IQM version %i is incorrect.", iqm.version);

        return (rf_model_animation_array){0};
    }

    rf_model_animation_array result = {
        .size = iqm.num_anims,
    };

    // Get bones data
    rf_iqm_pose* poses = (rf_iqm_pose*) RF_ALLOC(temp_allocator, iqm.num_poses * sizeof(rf_iqm_pose));
    memcpy(poses, data + iqm.ofs_poses, iqm.num_poses * sizeof(rf_iqm_pose));

    // Get animations data
    rf_iqm_anim* anim = (rf_iqm_anim*) RF_ALLOC(temp_allocator, iqm.num_anims * sizeof(rf_iqm_anim));
    memcpy(anim, data + iqm.ofs_anims, iqm.num_anims * sizeof(rf_iqm_anim));

    rf_model_animation* animations = (rf_model_animation*) RF_ALLOC(allocator, iqm.num_anims * sizeof(rf_model_animation));

    result.anims       = animations;
    result.size = iqm.num_anims;

    // frameposes
    unsigned short* framedata = (unsigned short*) RF_ALLOC(temp_allocator, iqm.num_frames * iqm.num_framechannels * sizeof(unsigned short));
    memcpy(framedata, data + iqm.ofs_frames, iqm.num_frames*iqm.num_framechannels * sizeof(unsigned short));

    for (rf_int a = 0; a < iqm.num_anims; a++)
    {
        animations[a].frame_count = anim[a].num_frames;
        animations[a].bone_count  = iqm.num_poses;
        animations[a].bones       = (rf_bone_info*) RF_ALLOC(allocator, iqm.num_poses * sizeof(rf_bone_info));
        animations[a].frame_poses = (rf_transform**) RF_ALLOC(allocator, anim[a].num_frames * sizeof(rf_transform*));
        //animations[a].framerate = anim.framerate;     // TODO: Use framerate?

        for (rf_int j = 0; j < iqm.num_poses; j++)
        {
            strcpy(animations[a].bones[j].name, "ANIMJOINTNAME");
            animations[a].bones[j].parent = poses[j].parent;
        }

        for (rf_int j = 0; j < anim[a].num_frames; j++)
        {
            animations[a].frame_poses[j] = (rf_transform*) RF_ALLOC(allocator, iqm.num_poses * sizeof(rf_transform));
        }

        int dcounter = anim[a].first_frame*iqm.num_framechannels;

        for (rf_int frame = 0; frame < anim[a].num_frames; frame++)
        {
            for (rf_int i = 0; i < iqm.num_poses; i++)
            {
                animations[a].frame_poses[frame][i].translation.x = poses[i].channeloffset[0];

                if (poses[i].mask & 0x01)
                {
                    animations[a].frame_poses[frame][i].translation.x += framedata[dcounter]*poses[i].channelscale[0];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].translation.y = poses[i].channeloffset[1];

                if (poses[i].mask & 0x02)
                {
                    animations[a].frame_poses[frame][i].translation.y += framedata[dcounter]*poses[i].channelscale[1];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].translation.z = poses[i].channeloffset[2];

                if (poses[i].mask & 0x04)
                {
                    animations[a].frame_poses[frame][i].translation.z += framedata[dcounter]*poses[i].channelscale[2];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation.x = poses[i].channeloffset[3];

                if (poses[i].mask & 0x08)
                {
                    animations[a].frame_poses[frame][i].rotation.x += framedata[dcounter]*poses[i].channelscale[3];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation.y = poses[i].channeloffset[4];

                if (poses[i].mask & 0x10)
                {
                    animations[a].frame_poses[frame][i].rotation.y += framedata[dcounter]*poses[i].channelscale[4];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation.z = poses[i].channeloffset[5];

                if (poses[i].mask & 0x20)
                {
                    animations[a].frame_poses[frame][i].rotation.z += framedata[dcounter]*poses[i].channelscale[5];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation.w = poses[i].channeloffset[6];

                if (poses[i].mask & 0x40)
                {
                    animations[a].frame_poses[frame][i].rotation.w += framedata[dcounter]*poses[i].channelscale[6];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].scale.x = poses[i].channeloffset[7];

                if (poses[i].mask & 0x80)
                {
                    animations[a].frame_poses[frame][i].scale.x += framedata[dcounter]*poses[i].channelscale[7];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].scale.y = poses[i].channeloffset[8];

                if (poses[i].mask & 0x100)
                {
                    animations[a].frame_poses[frame][i].scale.y += framedata[dcounter]*poses[i].channelscale[8];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].scale.z = poses[i].channeloffset[9];

                if (poses[i].mask & 0x200)
                {
                    animations[a].frame_poses[frame][i].scale.z += framedata[dcounter]*poses[i].channelscale[9];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation = rf_quaternion_normalize(animations[a].frame_poses[frame][i].rotation);
            }
        }

        // Build frameposes
        for (rf_int frame = 0; frame < anim[a].num_frames; frame++)
        {
            for (rf_int i = 0; i < animations[a].bone_count; i++)
            {
                if (animations[a].bones[i].parent >= 0)
                {
                    animations[a].frame_poses[frame][i].rotation    = rf_quaternion_mul(animations[a].frame_poses[frame][animations[a].bones[i].parent].rotation, animations[a].frame_poses[frame][i].rotation);
                    animations[a].frame_poses[frame][i].translation = rf_vec3_rotate_by_quaternion(animations[a].frame_poses[frame][i].translation, animations[a].frame_poses[frame][animations[a].bones[i].parent].rotation);
                    animations[a].frame_poses[frame][i].translation = rf_vec3_add(animations[a].frame_poses[frame][i].translation, animations[a].frame_poses[frame][animations[a].bones[i].parent].translation);
                    animations[a].frame_poses[frame][i].scale       = rf_vec3_mul_v(animations[a].frame_poses[frame][i].scale, animations[a].frame_poses[frame][animations[a].bones[i].parent].scale);
                }
            }
        }
    }

    RF_FREE(temp_allocator, framedata);
    RF_FREE(temp_allocator, poses);
    RF_FREE(temp_allocator, anim);

    return result;
}